

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]>::~QStringBuilder
          (QStringBuilder<QStringBuilder<const_char_(&)[22],_QByteArray>,_const_char_(&)[45]> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->a).b.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->a).b.d.d)->super_QArrayData,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

bool deref() noexcept { return !d || d->deref(); }